

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR reclaimarrayblock(LispPTR ptr)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  int iVar6;
  
  LVar3 = ptr - 2;
  pLVar4 = NativeAligned4FromLAddr(LVar3);
  if (((ptr & 0xfff0000) < 0x130000) || ((*(ushort *)((long)pLVar4 + 2) & 0xfff9) != 0xaaa9)) {
    error("Bad array block reclaimed--continue with \'q\' but save state ASAP. \n");
  }
  else {
    uVar1 = *(ushort *)((long)pLVar4 + 2) >> 1 & 3;
    if (uVar1 == 2) {
      LVar2 = reclaimcodeblock(ptr);
      if (LVar2 != 0) {
        return 1;
      }
    }
    else if (uVar1 == 1) {
      iVar6 = (uint)(ushort)*pLVar4 * 2 + -4;
      do {
        pLVar5 = NativeAligned4FromLAddr(ptr);
        if ((-1 < *(short *)((ulong)(*pLVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(*pLVar5,1);
        }
        *pLVar5 = 0;
        ptr = ptr + 2;
        iVar6 = iVar6 + -2;
      } while (iVar6 != 0);
    }
    makefreearrayblock(LVar3,(DLword)*pLVar4);
    LVar3 = mergebackward(LVar3);
    mergeforward(LVar3);
  }
  return 1;
}

Assistant:

LispPTR reclaimarrayblock(LispPTR ptr) {
  LispPTR tmpptr, btrailer;
  struct arrayblock *base;
  LispPTR *tmpp;
  int reclaim_p;

  reclaim_p = T;
#ifdef ARRAYCHECK
  checkarrayblock(ptr - ARRAYBLOCKHEADERWORDS, NIL, NIL);
#endif /* ARRAYCHECK */

  base = (struct arrayblock *)NativeAligned4FromLAddr(ptr - ARRAYBLOCKHEADERWORDS);
#ifdef ARRAYCHECK
  if (HILOC(ptr) < FIRSTARRAYSEGMENT) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error(
        "Bad array block reclaimed [not in array space].\nContinue with 'q' but save state ASAP. "
        "\n");
    return (T);
  } else if (ARRAYBLOCKPASSWORD != base->password) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error("Bad array block reclaimed [password wrong].\nContinue with 'q' but save state ASAP. \n");
    return (T);
  } else if (base->inuse == NIL) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error(
        "Bad array block reclaimed [block not in use].\nContinue with 'q' but save state ASAP. \n");
    return (T);
  }
#else
  /* Normal case, just tell the guy something's wrong: */
  if ((HILOC(ptr) < FIRSTARRAYSEGMENT) ||
      ((ARRAYBLOCKPASSWORD != base->password) || (base->inuse == NIL))) {
    error("Bad array block reclaimed--continue with 'q' but save state ASAP. \n");
    return (T);
  }
#endif /* ARRAYCHECK */

  switch (base->gctype) {
    case PTRBLOCK_GCT: {
      btrailer = (ptr - 2) + 2 * (base->arlen - ARRAYBLOCKTRAILERCELLS);
      tmpptr = ptr;
      do {
        tmpp = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
        /* GCLOOKUP(0x8000,DELREF, *tmpp);*/ /* added 8-Oct-87 TT */
        REC_GCLOOKUP(*tmpp, DELREF);
        *tmpp = NIL;
        tmpptr += 2;
      } while (tmpptr != btrailer);
      break;
    }
    case CODEBLOCK_GCT:
      reclaim_p = ((reclaimcodeblock(ptr) == NIL) ? T : NIL);

      /* default:   No Action */
  }
  if (reclaim_p == T)
    mergeforward(mergebackward(makefreearrayblock(ptr - ARRAYBLOCKHEADERWORDS, base->arlen)));
  return (T);
}